

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void __thiscall CRegTestParams::CRegTestParams(CRegTestParams *this,RegTestOptions *opts)

{
  initializer_list<AssumeutxoData> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<std::pair<const_int,_uint256>_> __l_02;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference pvVar4;
  type *ptVar5;
  type_conflict1 *ptVar6;
  type *ptVar7;
  type *ptVar8;
  int iVar9;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  type *version_bits_params;
  type *deployment_pos;
  unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
  *__range1_1;
  type *height;
  type *dep;
  unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CBlock *in_stack_fffffffffffffb18;
  CBlock *in_stack_fffffffffffffb20;
  CBlock *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator_type *in_stack_fffffffffffffb30;
  allocator_type *__a;
  CBlockHeader *in_stack_fffffffffffffb38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  iterator in_stack_fffffffffffffb40;
  iterator __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  allocator_type *in_stack_fffffffffffffb60;
  undefined4 *puVar10;
  less<int> *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *this_03;
  CChainParams *in_stack_fffffffffffffb78;
  undefined6 in_stack_fffffffffffffb80;
  undefined1 *puVar11;
  undefined1 local_3b2 [32];
  undefined1 local_392 [33];
  undefined1 local_371;
  uchar local_370 [24];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 local_33a [18];
  _Node_iterator_base<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false>
  local_328;
  _Node_iterator_base<std::pair<const_Consensus::BuriedDeployment,_int>,_false> local_320;
  _Node_iterator_base<std::pair<const_Consensus::BuriedDeployment,_int>,_false> local_318;
  undefined1 local_310;
  undefined1 local_30f;
  undefined1 local_30e;
  undefined1 local_30d;
  undefined1 local_30c;
  undefined1 local_30b;
  undefined1 local_30a;
  undefined1 local_309;
  undefined1 local_308;
  undefined1 local_307;
  undefined1 local_306;
  undefined1 local_305;
  undefined1 local_304;
  undefined1 local_303;
  undefined1 local_302;
  undefined1 local_301;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_2fe;
  undefined1 local_2fd;
  undefined1 local_2fc;
  undefined1 local_2fb;
  undefined1 local_2fa;
  undefined1 local_2f9;
  undefined1 local_2f8;
  undefined1 local_2f7;
  undefined1 local_2f6;
  undefined1 local_2f5;
  undefined1 local_2f4;
  undefined1 local_2f3;
  undefined1 local_2f2;
  undefined1 local_2f1;
  undefined1 local_2f0;
  undefined1 local_2ef;
  undefined1 local_2ee;
  undefined1 local_2ed;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  undefined1 local_2e8;
  undefined1 local_2e7;
  undefined1 local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e4;
  undefined1 local_2e3;
  undefined1 local_2e2;
  undefined1 local_2e1;
  undefined1 local_2e0;
  undefined1 local_2df;
  undefined1 local_2de;
  undefined1 local_2dd;
  undefined1 local_2dc;
  undefined1 local_2db;
  undefined1 local_2da;
  undefined1 local_2d9;
  undefined1 local_2d8;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  undefined1 local_2d4;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  undefined1 local_2d0;
  undefined1 local_2cf;
  undefined1 local_2ce;
  undefined1 local_2cd;
  undefined1 local_2cc;
  undefined1 local_2cb;
  undefined1 local_2ca;
  undefined1 local_2c9;
  undefined1 local_2c8;
  undefined1 local_2c7;
  undefined1 local_2c6;
  undefined1 local_2c5;
  undefined1 local_2c4;
  undefined1 local_2c3;
  undefined1 local_2c2;
  undefined1 local_2c1;
  undefined1 local_2c0;
  undefined1 local_2bf;
  undefined1 local_2be;
  undefined1 local_2bd;
  undefined1 local_2bc;
  undefined1 local_2bb;
  undefined1 local_2ba;
  undefined1 local_2b9;
  undefined1 local_2b8;
  undefined1 local_2b7;
  undefined1 local_2b6;
  undefined1 local_2b5;
  undefined1 local_2b4;
  undefined1 local_2b3;
  undefined1 local_2b2;
  undefined1 local_2b1;
  undefined1 local_2b0;
  undefined1 local_2af;
  undefined1 local_2ae;
  undefined1 local_2ad;
  undefined1 local_2ac;
  undefined1 local_2ab;
  undefined1 local_2aa;
  undefined1 local_2a9;
  undefined4 local_2a8;
  undefined8 local_280;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined4 local_258 [20];
  undefined4 local_208;
  undefined8 local_1e0;
  undefined1 local_1d8;
  undefined1 local_1d7;
  undefined1 local_1d6;
  undefined1 local_1d5;
  undefined1 local_1d4;
  undefined1 local_1d3;
  undefined1 local_1d2;
  undefined1 local_1d1;
  undefined1 local_1d0;
  undefined1 local_1cf;
  undefined1 local_1ce;
  undefined1 local_1cd;
  undefined1 local_1cc;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  undefined1 local_1c8;
  undefined1 local_1c7;
  undefined1 local_1c6;
  undefined1 local_1c5;
  undefined1 local_1c4;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  undefined1 local_1c0;
  undefined1 local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [112];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(in_stack_fffffffffffffb78);
  *(undefined4 *)(in_RDI + 0x48) = 3;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb18);
  *(undefined4 *)(in_RDI + 4) = 0x96;
  *(undefined4 *)(in_RDI + 0xb) = 1;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uint256::uint256((uint256 *)in_stack_fffffffffffffb18);
  *(undefined8 *)((long)in_RDI + 0x6c) = local_18;
  *(undefined8 *)((long)in_RDI + 0x74) = uStack_10;
  *(undefined8 *)((long)in_RDI + 0x5c) = local_28;
  *(undefined8 *)((long)in_RDI + 100) = uStack_20;
  *(undefined4 *)((long)in_RDI + 0x7c) = 1;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  *(undefined4 *)((long)in_RDI + 0x84) = 1;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  uStack_29 = 0x7f;
  uStack_2a = 0xff;
  uStack_2b = 0xff;
  uStack_2c = 0xff;
  uStack_2d = 0xff;
  uStack_2e = 0xff;
  uStack_2f = 0xff;
  uStack_30 = 0xff;
  uStack_31 = 0xff;
  uStack_32 = 0xff;
  uStack_33 = 0xff;
  uStack_34 = 0xff;
  uStack_35 = 0xff;
  uStack_36 = 0xff;
  uStack_37 = 0xff;
  local_38 = 0xff;
  uStack_39 = 0xff;
  uStack_3a = 0xff;
  uStack_3b = 0xff;
  uStack_3c = 0xff;
  uStack_3d = 0xff;
  uStack_3e = 0xff;
  uStack_3f = 0xff;
  uStack_40 = 0xff;
  uStack_41 = 0xff;
  uStack_42 = 0xff;
  uStack_43 = 0xff;
  uStack_44 = 0xff;
  uStack_45 = 0xff;
  uStack_46 = 0xff;
  uStack_47 = 0xff;
  local_48 = 0xff;
  in_RDI[0x1d] = 0xffffffffffffffff;
  in_RDI[0x1e] = 0x7fffffffffffffff;
  in_RDI[0x1b] = 0xffffffffffffffff;
  in_RDI[0x1c] = 0xffffffffffffffff;
  in_RDI[0x21] = 0x15180;
  in_RDI[0x20] = 600;
  *(undefined1 *)(in_RDI + 0x1f) = 1;
  *(undefined1 *)((long)in_RDI + 0xf9) = 1;
  *(undefined1 *)((long)in_RDI + 0xfa) = 1;
  *(undefined4 *)(in_RDI + 0x12) = 0x6c;
  *(undefined4 *)((long)in_RDI + 0x94) = 0x90;
  *(undefined4 *)(in_RDI + 0x13) = 0x1c;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined4 *)(in_RDI + 0x17) = 2;
  in_RDI[0x18] = 0xffffffffffffffff;
  in_RDI[0x19] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uint256::uint256((uint256 *)in_stack_fffffffffffffb18);
  in_RDI[0x24] = local_58;
  in_RDI[0x25] = uStack_50;
  in_RDI[0x22] = local_68;
  in_RDI[0x23] = uStack_60;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uint256::uint256((uint256 *)in_stack_fffffffffffffb18);
  in_RDI[0x26] = local_88;
  in_RDI[0x27] = uStack_80;
  in_RDI[0x28] = local_78;
  in_RDI[0x29] = uStack_70;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffb28,
                      (size_type)in_stack_fffffffffffffb20);
  *pvVar4 = 0xfa;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffb28,
                      (size_type)in_stack_fffffffffffffb20);
  *pvVar4 = 0xbf;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffb28,
                      (size_type)in_stack_fffffffffffffb20);
  *pvVar4 = 0xb5;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffb28,
                      (size_type)in_stack_fffffffffffffb20);
  *pvVar4 = 0xda;
  *(undefined2 *)((long)in_RDI + 0x174) = 0x480c;
  iVar9 = 1000;
  if ((*(byte *)(in_RSI + 0x70) & 1) != 0) {
    iVar9 = 100;
  }
  in_RDI[0x2f] = (long)iVar9;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  local_318._M_cur =
       (__node_type *)
       std::
       unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
       ::begin((unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
                *)in_stack_fffffffffffffb20);
  local_320._M_cur =
       (__node_type *)
       std::
       unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
       ::end((unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
              *)in_stack_fffffffffffffb20);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_Consensus::BuriedDeployment,_int>,_false>
                             *)in_stack_fffffffffffffb28,
                            (_Node_iterator_base<std::pair<const_Consensus::BuriedDeployment,_int>,_false>
                             *)in_stack_fffffffffffffb20), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_Consensus::BuriedDeployment,_int>,_false,_false>::operator*
              ((_Node_const_iterator<std::pair<const_Consensus::BuriedDeployment,_int>,_false,_false>
                *)in_stack_fffffffffffffb18);
    ptVar5 = std::get<0ul,Consensus::BuriedDeployment_const,int>
                       ((pair<const_Consensus::BuriedDeployment,_int> *)in_stack_fffffffffffffb18);
    ptVar6 = std::get<1ul,Consensus::BuriedDeployment_const,int>
                       ((pair<const_Consensus::BuriedDeployment,_int> *)in_stack_fffffffffffffb18);
    switch(*ptVar5) {
    case 0xffff8000:
      *(type_conflict1 *)(in_RDI + 0xb) = *ptVar6;
      break;
    case 0xffff8001:
      *(type_conflict1 *)((long)in_RDI + 0x7c) = *ptVar6;
      break;
    case 0xffff8002:
      *(type_conflict1 *)(in_RDI + 0x10) = *ptVar6;
      break;
    case 0xffff8003:
      *(type_conflict1 *)((long)in_RDI + 0x84) = *ptVar6;
      break;
    case 0xffff8004:
      *(type_conflict1 *)(in_RDI + 0x11) = *ptVar6;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Consensus::BuriedDeployment,_int>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_Consensus::BuriedDeployment,_int>,_false,_false>
                *)in_stack_fffffffffffffb18);
  }
  local_328._M_cur =
       (__node_type *)
       std::
       unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
       ::begin((unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
                *)in_stack_fffffffffffffb20);
  local_33a._10_8_ =
       std::
       unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
       ::end((unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
              *)in_stack_fffffffffffffb20);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false>
                             *)in_stack_fffffffffffffb28,
                            (_Node_iterator_base<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false>
                             *)in_stack_fffffffffffffb20), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false,_false>
    ::operator*((_Node_const_iterator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false,_false>
                 *)in_stack_fffffffffffffb18);
    ptVar7 = std::get<0ul,Consensus::DeploymentPos_const,CChainParams::VersionBitsParameters>
                       ((pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters> *
                        )in_stack_fffffffffffffb18);
    ptVar8 = std::get<1ul,Consensus::DeploymentPos_const,CChainParams::VersionBitsParameters>
                       ((pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters> *
                        )in_stack_fffffffffffffb18);
    in_RDI[(ulong)*ptVar7 * 4 + 0x14] = ptVar8->start_time;
    in_RDI[(ulong)*ptVar7 * 4 + 0x15] = ptVar8->timeout;
    *(int *)(in_RDI + (ulong)*ptVar7 * 4 + 0x16) = ptVar8->min_activation_height;
    std::__detail::
    _Node_const_iterator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_false,_false>
                  *)in_stack_fffffffffffffb18);
  }
  local_33a._2_8_ = 5000000000;
  CreateGenesisBlock((uint32_t)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffb78,
                     (uint32_t)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                     (int32_t)in_stack_fffffffffffffb70,(CAmount *)in_stack_fffffffffffffb68);
  puVar11 = local_f8;
  CBlock::operator=(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  CBlock::~CBlock(in_stack_fffffffffffffb18);
  CBlockHeader::GetHash(in_stack_fffffffffffffb38);
  in_RDI[2] = local_108;
  in_RDI[3] = uStack_100;
  *in_RDI = local_118;
  in_RDI[1] = uStack_110;
  local_119 = 0xf;
  local_11a = 0x91;
  local_11b = 0x88;
  local_11c = 0xf1;
  local_11d = 0x3c;
  local_11e = 0xb7;
  local_11f = 0xb2;
  local_120 = 199;
  local_121 = 0x1f;
  local_122 = 0x2a;
  local_123 = 0x33;
  local_124 = 0x5e;
  local_125 = 0x3a;
  local_126 = 0x4f;
  local_127 = 0xc3;
  local_128 = 0x28;
  local_129 = 0xbf;
  local_12a = 0x5b;
  local_12b = 0xeb;
  local_12c = 0x43;
  local_12d = 0x60;
  local_12e = 0x12;
  local_12f = 0xaf;
  local_130 = 0xca;
  local_131 = 0x59;
  local_132 = 0xb;
  local_133 = 0x1a;
  local_134 = 0x11;
  local_135 = 0x46;
  local_136 = 0x6e;
  local_137 = 0x22;
  local_138 = 6;
  uVar2 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb28,
                       (base_blob<256U> *)in_stack_fffffffffffffb20);
  if (!(bool)uVar2) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,600,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  local_139 = 0x4a;
  local_13a = 0x5e;
  local_13b = 0x1e;
  local_13c = 0x4b;
  local_13d = 0xaa;
  local_13e = 0xb8;
  local_13f = 0x9f;
  local_140 = 0x3a;
  local_141 = 0x32;
  local_142 = 0x51;
  local_143 = 0x8a;
  local_144 = 0x88;
  local_145 = 0xc3;
  local_146 = 0x1b;
  local_147 = 200;
  local_148 = 0x7f;
  local_149 = 0x61;
  local_14a = 0x8f;
  local_14b = 0x76;
  local_14c = 0x67;
  local_14d = 0x3e;
  local_14e = 0x2c;
  local_14f = 199;
  local_150 = 0x7a;
  local_151 = 0xb2;
  local_152 = 0x12;
  local_153 = 0x7b;
  local_154 = 0x7a;
  local_155 = 0xfd;
  local_156 = 0xed;
  local_157 = 0xa3;
  local_158 = 0x3b;
  uVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffb28,
                       (base_blob<256U> *)in_stack_fffffffffffffb20);
  if (!(bool)uVar3) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x259,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffb18);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[19]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb38,(char (*) [19])in_stack_fffffffffffffb30);
  *(undefined1 *)(in_RDI + 0x5a) = 1;
  *(undefined1 *)((long)in_RDI + 0x2d1) = 1;
  local_1a8 = 0x3a4fc328bf5beb43;
  uStack_1a0 = 0x3cb7b2c71f2a335e;
  local_1b8 = 0x466e220600000000;
  uStack_1b0 = 0x6012afca590b1a11;
  local_198 = 0xf9188f1;
  this_03 = (map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
            local_33a;
  std::allocator<std::pair<const_int,_uint256>_>::allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffb18);
  __l_02._M_array._6_1_ = uVar3;
  __l_02._M_array._0_6_ = in_stack_fffffffffffffb80;
  __l_02._M_array._7_1_ = uVar2;
  __l_02._M_len = (size_type)puVar11;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            (this_03,__l_02,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  CCheckpointData::operator=
            ((CCheckpointData *)in_stack_fffffffffffffb28,
             (CCheckpointData *)in_stack_fffffffffffffb20);
  CCheckpointData::~CCheckpointData((CCheckpointData *)in_stack_fffffffffffffb18);
  std::allocator<std::pair<const_int,_uint256>_>::~allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffb18);
  local_2a8 = 0x6e;
  local_2a9 = 0x66;
  local_2aa = 0x57;
  local_2ab = 0xb7;
  local_2ac = 0x36;
  local_2ad = 0xd4;
  local_2ae = 0xfe;
  local_2af = 0x4d;
  local_2b0 = 0xb0;
  local_2b1 = 0xcb;
  local_2b2 = 199;
  local_2b3 = 0x96;
  local_2b4 = 0x78;
  local_2b5 = 0x9e;
  local_2b6 = 0x81;
  local_2b7 = 0x2d;
  local_2b8 = 0x5d;
  local_2b9 = 0xba;
  local_2ba = 0x7f;
  local_2bb = 0x5c;
  local_2bc = 0x14;
  local_2bd = 0x37;
  local_2be = 100;
  local_2bf = 0xb1;
  local_2c0 = 0xb6;
  local_2c1 = 0x90;
  local_2c2 = 0x56;
  local_2c3 = 0x12;
  local_2c4 = 0xf1;
  local_2c5 = 0x83;
  local_2c6 = 6;
  local_2c7 = 9;
  local_2c8 = 0xd1;
  AssumeutxoHash::AssumeutxoHash((AssumeutxoHash *)in_stack_fffffffffffffb18,(uint256 *)0x1dbe2a);
  local_280 = 0x6f;
  local_259 = 0x69;
  local_25a = 0x6e;
  local_25b = 0x92;
  local_25c = 0x82;
  local_25d = 0x1f;
  local_25e = 0x65;
  local_25f = 0x54;
  local_260 = 0x9c;
  local_261 = 0x7e;
  local_262 = 0xe1;
  local_263 = 0x34;
  local_264 = 0xed;
  local_265 = 0xce;
  local_266 = 0xee;
  local_267 = 0xea;
  local_268 = 0xaa;
  local_269 = 0x41;
  local_26a = 5;
  local_26b = 100;
  local_26c = 0x7a;
  local_26d = 0x3c;
  local_26e = 0x4f;
  local_26f = 0xd9;
  local_270 = 0xf2;
  local_271 = 0x98;
  local_272 = 0xc0;
  local_273 = 0xae;
  local_274 = 0xc0;
  local_275 = 0xab;
  local_276 = 0x50;
  local_277 = 0x42;
  local_278 = 0x5c;
  puVar10 = local_258;
  local_258[0] = 200;
  local_2c9 = 0x4f;
  local_2ca = 0x34;
  local_2cb = 0xd4;
  local_2cc = 0x31;
  local_2cd = 0xc3;
  local_2ce = 0xe4;
  local_2cf = 0x82;
  local_2d0 = 0xf6;
  local_2d1 = 0xb0;
  local_2d2 = 0xd6;
  local_2d3 = 0x7b;
  local_2d4 = 100;
  local_2d5 = 0x60;
  local_2d6 = 0x9e;
  local_2d7 = 0xce;
  local_2d8 = 0x39;
  local_2d9 = 100;
  local_2da = 0xdc;
  local_2db = 0x8d;
  local_2dc = 0x79;
  local_2dd = 0x76;
  local_2de = 0xd0;
  local_2df = 0x2a;
  local_2e0 = 0xc6;
  local_2e1 = 0x8d;
  local_2e2 = 0xd7;
  local_2e3 = 0xc9;
  local_2e4 = 0xc1;
  local_2e5 = 0x42;
  local_2e6 = 0x17;
  local_2e7 = 0x38;
  local_2e8 = 0xf2;
  AssumeutxoHash::AssumeutxoHash((AssumeutxoHash *)in_stack_fffffffffffffb18,(uint256 *)0x1dc065);
  *(undefined8 *)(puVar10 + 10) = 0xc9;
  *(undefined1 *)((long)puVar10 + 0x4f) = 0x5e;
  *(undefined1 *)((long)puVar10 + 0x4e) = 0x93;
  *(undefined1 *)((long)puVar10 + 0x4d) = 0x65;
  *(undefined1 *)(puVar10 + 0x13) = 0x33;
  *(undefined1 *)((long)puVar10 + 0x4b) = 0x18;
  *(undefined1 *)((long)puVar10 + 0x4a) = 0xf2;
  *(undefined1 *)((long)puVar10 + 0x49) = 0x94;
  *(undefined1 *)(puVar10 + 0x12) = 0xfb;
  *(undefined1 *)((long)puVar10 + 0x47) = 0x5a;
  *(undefined1 *)((long)puVar10 + 0x46) = 0xa3;
  *(undefined1 *)((long)puVar10 + 0x45) = 0x39;
  *(undefined1 *)(puVar10 + 0x11) = 0xd0;
  *(undefined1 *)((long)puVar10 + 0x43) = 0xb;
  *(undefined1 *)((long)puVar10 + 0x42) = 0xbf;
  *(undefined1 *)((long)puVar10 + 0x41) = 0x8c;
  *(undefined1 *)(puVar10 + 0x10) = 0xf1;
  *(undefined1 *)((long)puVar10 + 0x3f) = 0xc3;
  *(undefined1 *)((long)puVar10 + 0x3e) = 0x51;
  *(undefined1 *)((long)puVar10 + 0x3d) = 0x54;
  *(undefined1 *)(puVar10 + 0xf) = 0x88;
  *(undefined1 *)((long)puVar10 + 0x3b) = 0xad;
  *(undefined1 *)((long)puVar10 + 0x3a) = 0x99;
  *(undefined1 *)((long)puVar10 + 0x39) = 0x41;
  *(undefined1 *)(puVar10 + 0xe) = 0x2c;
  *(undefined1 *)((long)puVar10 + 0x37) = 0x37;
  *(undefined1 *)((long)puVar10 + 0x36) = 0x60;
  *(undefined1 *)((long)puVar10 + 0x35) = 0x8b;
  *(undefined1 *)(puVar10 + 0xd) = 0x13;
  *(undefined1 *)((long)puVar10 + 0x33) = 0x9e;
  *(undefined1 *)((long)puVar10 + 0x32) = 0xa6;
  *(undefined1 *)((long)puVar10 + 0x31) = 0x3b;
  *(undefined1 *)(puVar10 + 0xc) = 0x27;
  local_208 = 299;
  local_2e9 = 0xa4;
  local_2ea = 0xbf;
  local_2eb = 0x34;
  local_2ec = 7;
  local_2ed = 0xcc;
  local_2ee = 0xb2;
  local_2ef = 0xcc;
  local_2f0 = 1;
  local_2f1 = 0x45;
  local_2f2 = 0xc4;
  local_2f3 = 0x9e;
  local_2f4 = 0xbb;
  local_2f5 = 0xa8;
  local_2f6 = 0xfa;
  local_2f7 = 0x91;
  local_2f8 = 0x19;
  local_2f9 = 0x9f;
  local_2fa = 0x8a;
  local_2fb = 0x39;
  local_2fc = 3;
  local_2fd = 0xda;
  local_2fe = 0xf0;
  local_2ff = 0x88;
  local_300 = 0x38;
  local_301 = 0x75;
  local_302 = 0x94;
  local_303 = 0x14;
  local_304 = 0x97;
  local_305 = 0xd2;
  local_306 = 0x49;
  local_307 = 0x3c;
  local_308 = 0x27;
  AssumeutxoHash::AssumeutxoHash((AssumeutxoHash *)in_stack_fffffffffffffb18,(uint256 *)0x1dc221);
  local_1e0 = 0x14e;
  local_1b9 = 0x3b;
  local_1ba = 0xb7;
  local_1bb = 0xce;
  local_1bc = 0x5e;
  local_1bd = 0xba;
  local_1be = 0xb;
  local_1bf = 0xe4;
  local_1c0 = 0x89;
  local_1c1 = 0x39;
  local_1c2 = 0xb7;
  local_1c3 = 0xa5;
  local_1c4 = 0x21;
  local_1c5 = 0xac;
  local_1c6 = 0x1b;
  local_1c7 = 0xa9;
  local_1c8 = 0x31;
  local_1c9 = 0x6a;
  local_1ca = 0xfe;
  local_1cb = 0xe2;
  local_1cc = 199;
  local_1cd = 0xba;
  local_1ce = 0xda;
  local_1cf = 0x3a;
  local_1d0 = 0xc;
  local_1d1 = 0xca;
  local_1d2 = 0x24;
  local_1d3 = 0x18;
  local_1d4 = 0x8e;
  local_1d5 = 0x6d;
  local_1d6 = 0x7d;
  local_1d7 = 0x96;
  local_1d8 = 0xc0;
  __l._M_len = (size_type)in_stack_fffffffffffffb48;
  __l._M_array = in_stack_fffffffffffffb40;
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::operator=
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)in_stack_fffffffffffffb38,
             __l);
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  in_RDI[0x66] = 0;
  in_RDI[100] = 0;
  in_RDI[0x65] = 0;
  local_371 = 0x6f;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffb48,(size_type)in_stack_fffffffffffffb40,
             (value_type_conflict *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  __n = local_370;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  local_392[1] = 0xc4;
  this_02 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_392;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_02,(size_type)__n,(value_type_conflict *)in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30);
  __a = (allocator_type *)(local_392 + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  local_3b2[1] = 0xef;
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b2;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_02,(size_type)__n,(value_type_conflict *)this_01,__a);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b2 + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffb18);
  local_30c = 4;
  local_30b = 0x35;
  local_30a = 0x87;
  local_309 = 0xcf;
  __l_00._M_len = (size_type)this_02;
  __l_00._M_array = __n;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_01,__l_00);
  local_310 = 4;
  local_30f = 0x35;
  local_30e = 0x83;
  local_30d = 0x94;
  __l_01._M_len = (size_type)this_02;
  __l_01._M_array = __n;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_01,__l_01);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,(char *)in_stack_fffffffffffffb20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

explicit CRegTestParams(const RegTestOptions& opts)
    {
        m_chain_type = ChainType::REGTEST;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 150;
        consensus.BIP34Height = 1; // Always active unless overridden
        consensus.BIP34Hash = uint256();
        consensus.BIP65Height = 1;  // Always active unless overridden
        consensus.BIP66Height = 1;  // Always active unless overridden
        consensus.CSVHeight = 1;    // Always active unless overridden
        consensus.SegwitHeight = 0; // Always active unless overridden
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 24 * 60 * 60; // one day
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = true;
        consensus.nRuleChangeActivationThreshold = 108; // 75% for testchains
        consensus.nMinerConfirmationWindow = 144; // Faster than normal for regtest (144 instead of 2016)

        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = 0;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{};
        consensus.defaultAssumeValid = uint256{};

        pchMessageStart[0] = 0xfa;
        pchMessageStart[1] = 0xbf;
        pchMessageStart[2] = 0xb5;
        pchMessageStart[3] = 0xda;
        nDefaultPort = 18444;
        nPruneAfterHeight = opts.fastprune ? 100 : 1000;
        m_assumed_blockchain_size = 0;
        m_assumed_chain_state_size = 0;

        for (const auto& [dep, height] : opts.activation_heights) {
            switch (dep) {
            case Consensus::BuriedDeployment::DEPLOYMENT_SEGWIT:
                consensus.SegwitHeight = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_HEIGHTINCB:
                consensus.BIP34Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_DERSIG:
                consensus.BIP66Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CLTV:
                consensus.BIP65Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CSV:
                consensus.CSVHeight = int{height};
                break;
            }
        }

        for (const auto& [deployment_pos, version_bits_params] : opts.version_bits_parameters) {
            consensus.vDeployments[deployment_pos].nStartTime = version_bits_params.start_time;
            consensus.vDeployments[deployment_pos].nTimeout = version_bits_params.timeout;
            consensus.vDeployments[deployment_pos].min_activation_height = version_bits_params.min_activation_height;
        }

        genesis = CreateGenesisBlock(1296688602, 2, 0x207fffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear(); //!< Regtest mode doesn't have any fixed seeds.
        vSeeds.clear();
        vSeeds.emplace_back("dummySeed.invalid.");

        fDefaultConsistencyChecks = true;
        m_is_mockable_chain = true;

        checkpointData = {
            {
                {0, uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"}},
            }
        };

        m_assumeutxo_data = {
            {   // For use by unit tests
                .height = 110,
                .hash_serialized = AssumeutxoHash{uint256{"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1"}},
                .m_chain_tx_count = 111,
                .blockhash = consteval_ctor(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"}),
            },
            {
                // For use by fuzz target src/test/fuzz/utxo_snapshot.cpp
                .height = 200,
                .hash_serialized = AssumeutxoHash{uint256{"4f34d431c3e482f6b0d67b64609ece3964dc8d7976d02ac68dd7c9c1421738f2"}},
                .m_chain_tx_count = 201,
                .blockhash = consteval_ctor(uint256{"5e93653318f294fb5aa339d00bbf8cf1c3515488ad99412c37608b139ea63b27"}),
            },
            {
                // For use by test/functional/feature_assumeutxo.py
                .height = 299,
                .hash_serialized = AssumeutxoHash{uint256{"a4bf3407ccb2cc0145c49ebba8fa91199f8a3903daf0883875941497d2493c27"}},
                .m_chain_tx_count = 334,
                .blockhash = consteval_ctor(uint256{"3bb7ce5eba0be48939b7a521ac1ba9316afee2c7bada3a0cca24188e6d7d96c0"}),
            },
        };

        chainTxData = ChainTxData{
            0,
            0,
            0
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "bcrt";
    }